

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O3

string * __thiscall
pstack::Dwarf::Unit::strx_abi_cxx11_(string *__return_storage_ptr__,Unit *this,size_t idx)

{
  size_t len;
  undefined8 uVar1;
  intmax_t iVar2;
  uintmax_t uVar3;
  Exception *this_00;
  undefined1 local_218 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  uint local_1f8;
  DIE local_78;
  undefined1 local_50 [16];
  element_type *peStack_40;
  
  if ((this->dwarf->debugStrOffsets->shdr).sh_type != 0) {
    root(&local_78,this);
    DIE::attribute((Attribute *)local_218,&local_78,DW_AT_str_offsets_base,false);
    local_50._0_8_ = __return_storage_ptr__;
    iVar2 = DIE::Attribute::operator_cast_to_long((Attribute *)local_218);
    DIE::~DIE((DIE *)local_218);
    DIE::~DIE(&local_78);
    len = this->dwarfLen;
    Elf::Section::io((Section *)(local_50 + 8));
    local_218._0_8_ = idx * len + iVar2;
    local_218._8_8_ = (**(code **)(*(long *)local_50._8_8_ + 0x40))();
    local_208._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_40;
    local_50._8_8_ = 0;
    peStack_40 = (element_type *)0x0;
    local_1f8 = 8;
    Elf::Section::io((Section *)&local_78);
    uVar1 = local_50._0_8_;
    uVar3 = DWARFReader::getuint((DWARFReader *)local_218,len);
    (*(*(_func_int ***)local_78.offset)[7])(uVar1,local_78.offset,uVar3);
    if (local_78.raw.super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_78.raw.
                 super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if ((element_type *)_Stack_200._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_200._M_pi);
    }
    return (string *)uVar1;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
  memset((Exception *)local_218,0,0x1a0);
  Exception::Exception((Exception *)local_218);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_218 + 8),"no string offsets table, but have strx form",0x2b);
  Exception::Exception(this_00,(Exception *)local_218);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

std::string
Unit::strx(size_t idx) {
    if (!dwarf->debugStrOffsets)
        throw Exception() << "no string offsets table, but have strx form";
    // Get the root die, and the string offset base.
    auto base = intmax_t(root().attribute(DW_AT_str_offsets_base));
    auto len = dwarfLen;
    DWARFReader r(dwarf->debugStrOffsets.io(), base + len * idx);
    return dwarf->debugStrings.io()->readString(r.getuint(len));
}